

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

void cf_socket_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  int sock;
  void *pvVar1;
  curl_trc_feat *pcVar2;
  char *fmt;
  
  pvVar1 = cf->ctx;
  sock = *(int *)((long)pvVar1 + 0x98);
  if (sock != -1) {
    if ((*(byte *)((long)pvVar1 + 0x134) & 2) == 0) {
      if ((cf->field_0x24 & 1) == 0) {
        Curl_pollset_change(data,ps,sock,2,1);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < cf->cft->log_level)) {
          fmt = "adjust_pollset, !connected, POLLOUT fd=%d";
          goto LAB_00115ff7;
        }
      }
      else if ((*(byte *)((long)pvVar1 + 0x134) & 0x10) == 0) {
        Curl_pollset_change(data,ps,sock,1,0);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < cf->cft->log_level)) {
          fmt = "adjust_pollset, !active, POLLIN fd=%d";
          goto LAB_00115ff7;
        }
      }
    }
    else {
      Curl_pollset_change(data,ps,sock,1,2);
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        fmt = "adjust_pollset, listening, POLLIN fd=%d";
LAB_00115ff7:
        Curl_trc_cf_infof(data,cf,fmt,(ulong)*(uint *)((long)pvVar1 + 0x98));
        return;
      }
    }
  }
  return;
}

Assistant:

static void cf_socket_adjust_pollset(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      struct easy_pollset *ps)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx->sock != CURL_SOCKET_BAD) {
    /* A listening socket filter needs to be connected before the accept
     * for some weird FTP interaction. This should be rewritten, so that
     * FTP no longer does the socket checks and accept calls and delegates
     * all that to the filter. */
    if(ctx->listening) {
      Curl_pollset_set_in_only(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset, listening, POLLIN fd=%"
                  FMT_SOCKET_T, ctx->sock);
    }
    else if(!cf->connected) {
      Curl_pollset_set_out_only(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset, !connected, POLLOUT fd=%"
                  FMT_SOCKET_T, ctx->sock);
    }
    else if(!ctx->active) {
      Curl_pollset_add_in(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset, !active, POLLIN fd=%"
                  FMT_SOCKET_T, ctx->sock);
    }
  }
}